

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

TPZSkylMatrix<std::complex<double>_> * __thiscall
TPZSkylMatrix<std::complex<double>_>::operator*
          (TPZSkylMatrix<std::complex<double>_> *__return_storage_ptr__,
          TPZSkylMatrix<std::complex<double>_> *this,complex<double> value)

{
  complex<double> **ppcVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  complex<double> *this_00;
  int64_t col;
  long lVar4;
  bool bVar5;
  complex<double> local_40;
  
  TPZSkylMatrix(__return_storage_ptr__,this);
  lVar4 = 0;
  while( true ) {
    iVar2 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0xc])(this);
    if (CONCAT44(extraout_var,iVar2) <= lVar4) break;
    ppcVar1 = (this->fElem).fStore;
    lVar3 = (long)ppcVar1[lVar4 + 1] - (long)ppcVar1[lVar4] >> 4;
    this_00 = (__return_storage_ptr__->fElem).fStore[lVar4];
    if (lVar3 < 1) {
      lVar3 = 0;
    }
    while (bVar5 = lVar3 != 0, lVar3 = lVar3 + -1, bVar5) {
      std::complex<double>::operator*=(this_00,&local_40);
      this_00 = this_00 + 1;
    }
    lVar4 = lVar4 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

TPZSkylMatrix<TVar>
TPZSkylMatrix<TVar>::operator*(const TVar value ) const
{
	auto res(*this);
	
	for ( int64_t col = 0; col < this->Dim(); col++ )
    {
		// Aloca nova coluna para o resultado.
		int64_t colsize = Size(col);
		// Efetua a SOMA.
		TVar *elemRes  = res.fElem[col];
		for ( int64_t i = 0; i < colsize; i++ )
			*elemRes++ *= value;
    }
	
	return res;
}